

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef BinaryenTupleMakeGetOperandAt(BinaryenExpressionRef expr,BinaryenIndex index)

{
  if (expr->_id != TupleMakeId) {
    __assert_fail("expression->is<TupleMake>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xf26,
                  "BinaryenExpressionRef BinaryenTupleMakeGetOperandAt(BinaryenExpressionRef, BinaryenIndex)"
                 );
  }
  if ((ulong)index < expr[1].type.id) {
    return *(BinaryenExpressionRef *)(*(long *)(expr + 1) + (ulong)index * 8);
  }
  __assert_fail("index < usedElements",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                ,0xbc,
                "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
               );
}

Assistant:

BinaryenExpressionRef BinaryenTupleMakeGetOperandAt(BinaryenExpressionRef expr,
                                                    BinaryenIndex index) {
  auto* expression = (Expression*)expr;
  assert(expression->is<TupleMake>());
  return static_cast<TupleMake*>(expression)->operands[index];
}